

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  uint uVar1;
  size_t sVar2;
  ENetChannel *pEVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  enet_uint32 *peVar7;
  ENetPeer *pEVar8;
  ENetProtocol command;
  ENetProtocol local_60;
  
  sVar2 = 0xff;
  if (channelCount < 0xff) {
    sVar2 = channelCount;
  }
  sVar6 = 1;
  if (channelCount != 0) {
    sVar6 = sVar2;
  }
  if (0 < (long)host->peerCount) {
    peVar7 = &host->peers->windowSize;
    do {
      if (peVar7[-0x27] == ENET_PEER_STATE_DISCONNECTED) {
        pEVar3 = (ENetChannel *)enet_malloc(sVar6 * 0x50);
        *(ENetChannel **)(peVar7 + -0x25) = pEVar3;
        if (pEVar3 == (ENetChannel *)0x0) {
          return (ENetPeer *)0x0;
        }
        *(size_t *)(peVar7 + -0x23) = sVar6;
        peVar7[-0x27] = ENET_PEER_STATE_CONNECTING;
        *(ENetAddress *)(peVar7 + -0x2c) = *address;
        local_60.connect.connectID = host->randomSeed + 1;
        host->randomSeed = local_60.connect.connectID;
        peVar7[-0x2e] = local_60.connect.connectID;
        uVar4 = host->outgoingBandwidth;
        if (uVar4 != 0) {
          uVar5 = uVar4 >> 4 & 0xffff000;
          *peVar7 = uVar5;
          if (uVar5 == 0) {
            *peVar7 = 0x1000;
            uVar5 = 0x1000;
            goto LAB_0015e5d9;
          }
          if (uVar5 < 0x10001) goto LAB_0015e5d9;
        }
        *peVar7 = 0x10000;
        uVar5 = 0x10000;
LAB_0015e5d9:
        if (sVar6 != 0) {
          do {
            pEVar3->outgoingReliableSequenceNumber = 0;
            pEVar3->outgoingUnreliableSequenceNumber = 0;
            pEVar3->incomingReliableSequenceNumber = 0;
            pEVar3->incomingUnreliableSequenceNumber = 0;
            enet_list_clear(&pEVar3->incomingReliableCommands);
            enet_list_clear(&pEVar3->incomingUnreliableCommands);
            pEVar3->reliableWindows[7] = 0;
            pEVar3->reliableWindows[8] = 0;
            pEVar3->reliableWindows[9] = 0;
            pEVar3->reliableWindows[10] = 0;
            pEVar3->reliableWindows[0xb] = 0;
            pEVar3->reliableWindows[0xc] = 0;
            pEVar3->reliableWindows[0xd] = 0;
            pEVar3->reliableWindows[0xe] = 0;
            pEVar3->usedReliableWindows = 0;
            pEVar3->reliableWindows[0] = 0;
            pEVar3->reliableWindows[1] = 0;
            pEVar3->reliableWindows[2] = 0;
            pEVar3->reliableWindows[3] = 0;
            pEVar3->reliableWindows[4] = 0;
            pEVar3->reliableWindows[5] = 0;
            pEVar3->reliableWindows[6] = 0;
            pEVar3->reliableWindows[0xf] = 0;
            pEVar3 = pEVar3 + 1;
          } while (pEVar3 < *(ENetChannel **)(peVar7 + -0x25) + sVar6);
          local_60.connect.connectID = peVar7[-0x2e];
          uVar5 = *peVar7;
          uVar4 = host->outgoingBandwidth;
        }
        local_60._0_2_ = 0xff82;
        local_60.acknowledge.receivedReliableSequenceNumber =
             *(enet_uint16 *)((long)peVar7 + -0xba) << 8 |
             *(enet_uint16 *)((long)peVar7 + -0xba) >> 8;
        local_60.connect.incomingSessionID = *(enet_uint8 *)((long)peVar7 + -0xb3);
        local_60.connect.outgoingSessionID = *(undefined1 *)(peVar7 + -0x2d);
        uVar1 = peVar7[-1];
        local_60.connect.mtu =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        local_60.connect.windowSize =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_60.connect.channelCount = (int)sVar6 << 0x18;
        uVar5 = host->incomingBandwidth;
        local_60.connect.incomingBandwidth =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_60.connect.outgoingBandwidth =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar4 = peVar7[-0xc];
        local_60.connect.packetThrottleInterval =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar4 = peVar7[-0xe];
        local_60.connect.packetThrottleAcceleration =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar4 = peVar7[-0xd];
        local_60.connect.packetThrottleDeceleration =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        local_60.connect.data =
             data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
        enet_peer_queue_outgoing_command
                  ((ENetPeer *)(peVar7 + -0x35),&local_60,(ENetPacket *)0x0,0,0);
        return (ENetPeer *)(peVar7 + -0x35);
      }
      pEVar8 = (ENetPeer *)(peVar7 + 0x3d);
      peVar7 = peVar7 + 0x72;
    } while (pEVar8 < host->peers + host->peerCount);
  }
  return (ENetPeer *)0x0;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (currentPeer >= & host -> peers [host -> peerCount])
      return NULL;

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_16 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}